

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O3

Data * __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::NewSingleChunk
          (StringBuilder<Memory::ArenaAllocator> *this,charcount_t *pBufLengthRequested)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Data *pDVar8;
  uint uVar9;
  uint uVar10;
  
  uVar10 = *pBufLengthRequested;
  if (0x7ffffffe < uVar10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x4d,"(*pBufLengthRequested <= MaxLength)",
                                "*pBufLengthRequested <= MaxLength");
    if (!bVar5) goto LAB_007589dc;
    *puVar7 = 0;
    uVar10 = *pBufLengthRequested;
    if (0x7ffffffe < uVar10) {
      ::Math::DefaultOverflowPolicy();
    }
  }
  uVar2 = (ulong)uVar10 * 2 + 0x11;
  uVar3 = (uVar2 >> 4) * 8 - 1;
  if (uVar3 >> 0x20 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x59,"(newLength == size_t_newLength)",
                                "newLength == size_t_newLength");
    if (!bVar5) goto LAB_007589dc;
    *puVar7 = 0;
  }
  uVar10 = (uint)uVar3;
  if ((int)uVar10 < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x5a,"(newLength <= MaxLength + 1)","newLength <= MaxLength + 1");
    if (!bVar5) goto LAB_007589dc;
    *puVar7 = 0;
  }
  uVar9 = 0x7ffffffe;
  if ((int)uVar10 < 0x7ffffffe) {
    uVar9 = uVar10;
  }
  if (0x7ffffffe < uVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x61,"(newLength <= MaxLength)","newLength <= MaxLength");
    if (!bVar5) goto LAB_007589dc;
    *puVar7 = 0;
  }
  this_00 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  BVar6 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar5) goto LAB_007589dc;
    *puVar7 = 0;
  }
  pDVar8 = (Data *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal(this_00,(uVar2 & 0xfffffffffffffff0) + 0x10);
  if (pDVar8 == (Data *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar5) {
LAB_007589dc:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  pcVar1 = (char *)((long)&pDVar8->u + (ulong)uVar9 * 2);
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  *pBufLengthRequested = uVar9;
  return pDVar8;
}

Assistant:

Data *NewSingleChunk(charcount_t *pBufLengthRequested)
        {
            Assert(*pBufLengthRequested <= MaxLength);

            // Let's just grow the current chunk in place

            CompileAssert(sizeof(charcount_t) == sizeof(uint32));

            //// allocation = (bufLengthRequested+1) * sizeof(char16)
            charcount_t alloc32 = UInt32Math::AddMul< 1, sizeof(char16) >(*pBufLengthRequested);

            size_t allocation = HeapInfo::GetAlignedSize(alloc32);
            size_t size_t_newLength  = allocation / sizeof(char16) - 1;
            charcount_t newLength = (charcount_t)size_t_newLength;
            Assert(newLength == size_t_newLength);
            Assert(newLength <= MaxLength + 1);
            if (newLength == MaxLength + 1)
            {
                // newLength could be MaxLength + 1 because of alignment.
                // In this case alloc size is 2 elements more than newLength (normally 1 elements more for NULL), that's fine.
                newLength = MaxLength;
            }
            Assert(newLength <= MaxLength);

            Data* newChunk = AllocatorNewStructPlus(TAllocator, this->alloc, allocation, Data);
            newChunk->u.single.buffer[newLength] = _u('\0');

            *pBufLengthRequested = newLength;
            return newChunk;
        }